

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O3

vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> * __thiscall
OpenMD::AtomType::allYourBase
          (vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *__return_storage_ptr__,
          AtomType *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->hasBase_ == true) {
    allYourBase(&local_28,this->base_);
    ppAVar1 = (__return_storage_ptr__->
              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppAVar2 = (__return_storage_ptr__->
              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->
    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_28.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_28.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_28.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_28.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppAVar1 != (pointer)0x0) {
      operator_delete(ppAVar1,(long)ppAVar2 - (long)ppAVar1);
      if (local_28.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_28.
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_28.
                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_28.
                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_28.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::_M_insert_rval
              (__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
               super__Vector_impl_data._M_start,(value_type *)&local_28);
  }
  else {
    local_28.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>::
    emplace_back<OpenMD::AtomType*>
              ((vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>> *)__return_storage_ptr__
               ,(AtomType **)&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<AtomType*> AtomType::allYourBase() {
    std::vector<AtomType*> myChain;

    if (hasBase_) {
      myChain = base_->allYourBase();
      myChain.insert(myChain.begin(), this);
    } else {
      myChain.push_back(this);
    }

    return myChain;
  }